

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O2

void duckdb::ValidityFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  idx_t iVar1;
  BufferManager *pBVar2;
  data_ptr_t pdVar3;
  unsigned_long uVar4;
  ValidityMask mask;
  BufferHandle handle;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  __int_type local_48;
  BufferHandle local_40;
  
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&local_40,pBVar2,&segment->block);
  pdVar3 = BufferHandle::Ptr(&local_40);
  iVar1 = segment->offset;
  local_48 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
             super___atomic_base<unsigned_long>._M_i;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  FlatVector::VerifyFlatVector(result);
  uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  if ((*(ulong *)(pdVar3 + (uVar4 >> 6) * 8 + iVar1) >> (uVar4 & 0x3f) & 1) == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,result_idx);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  BufferHandle::~BufferHandle(&local_40);
  return;
}

Assistant:

void ValidityFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	D_ASSERT(row_id >= 0 && row_id < row_t(segment.count));
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto dataptr = handle.Ptr() + segment.GetBlockOffset();
	ValidityMask mask(reinterpret_cast<validity_t *>(dataptr), segment.count);
	auto &result_mask = FlatVector::Validity(result);
	if (!mask.RowIsValidUnsafe(NumericCast<idx_t>(row_id))) {
		result_mask.SetInvalid(result_idx);
	}
}